

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O0

void __thiscall ValueHashTable<ExprHash,_Value_*>::Init(ValueHashTable<ExprHash,_Value_*> *this)

{
  uint local_14;
  uint i;
  ValueHashTable<ExprHash,_Value_*> *this_local;
  
  this->table = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                (this + 1);
  for (local_14 = 0; local_14 < this->tableSize; local_14 = local_14 + 1) {
    SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::SListBase
              (this->table + local_14);
  }
  return;
}

Assistant:

void Init()
    {
        table = (SListBase<HashBucket> *)(((char *)this) + sizeof(ValueHashTable));
        for (uint i = 0; i < tableSize; i++)
        {
            // placement new
            ::new (&table[i]) SListBase<HashBucket>();
        }
    }